

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::HasHasbitTest_TestHasHasbitExplicitPresence_Test::
~HasHasbitTest_TestHasHasbitExplicitPresence_Test
          (HasHasbitTest_TestHasHasbitExplicitPresence_Test *this)

{
  Test *this_00;
  
  this_00 = (Test *)((long)&this[-1].super_HasHasbitTest.foo_proto_.field_0 + 0xe0);
  *(undefined ***)((long)&this[-1].super_HasHasbitTest.foo_proto_.field_0 + 0xe0) =
       &PTR__HasHasbitTest_018e1dd8;
  (this->super_HasHasbitTest).
  super_TestWithParam<google::protobuf::descriptor_unittest::HasHasbitTestParam>.super_Test.
  _vptr_Test = (_func_int **)&DAT_018e1e18;
  FileDescriptorProto::~FileDescriptorProto
            ((FileDescriptorProto *)
             ((long)&(this->super_HasHasbitTest).pool_.direct_input_files_.
                     super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     .
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             + 0x18));
  DescriptorPool::~DescriptorPool
            ((DescriptorPool *)
             &(this->super_HasHasbitTest).
              super_TestWithParam<google::protobuf::descriptor_unittest::HasHasbitTestParam>.
              super_Test.gtest_flag_saver_);
  testing::Test::~Test(this_00);
  operator_delete(this_00,400);
  return;
}

Assistant:

TEST_P(HasHasbitTest, TestHasHasbitExplicitPresence) {
  EXPECT_EQ(GetField()->has_presence(),
            GetParam().expected_output.expected_has_presence);
  EXPECT_EQ(GetFieldHasbitMode(GetField()),
            GetParam().expected_output.expected_hasbitmode);
  EXPECT_EQ(HasHasbit(GetField()),
            GetParam().expected_output.expected_has_hasbit);
}